

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18dr1.cpp
# Opt level: O3

int main(void)

{
  ulong uVar1;
  undefined8 uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  int iVar12;
  undefined1 auVar11 [16];
  int iVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  int aa [10];
  int local_28 [10];
  
  f(ga,10);
  uVar1 = 0;
  do {
    if ((uVar1 & 0x7ffffffffffffffc) == 0) {
      uVar2 = 0;
      uVar3 = 1;
      uVar4 = 1;
      uVar5 = 1;
      uVar6 = 1;
      uVar7 = 1;
      uVar8 = 2;
      uVar9 = 3;
      uVar10 = 4;
    }
    else if ((uVar1 & 0x7ffffffffffffffc) == 4) {
      uVar2 = 4;
      uVar3 = 1;
      uVar4 = 2;
      uVar5 = 3;
      uVar6 = 4;
      uVar7 = 5;
      uVar8 = 0xc;
      uVar9 = 0x15;
      uVar10 = 0x20;
    }
    else {
      uVar2 = 8;
      uVar3 = 5;
      uVar4 = 0xc;
      uVar5 = 0x15;
      uVar6 = 0x20;
      uVar7 = 0x2d;
      uVar8 = 0x78;
      uVar9 = 0xe7;
      uVar10 = 0x180;
    }
    auVar11._8_4_ = (int)uVar1;
    auVar11._0_8_ = uVar1;
    auVar11._12_4_ = (int)(uVar1 >> 0x20);
    auVar15._8_4_ = (int)uVar2;
    auVar15._0_8_ = uVar2;
    auVar15._12_4_ = 0;
    auVar11 = auVar11 ^ _DAT_00102060;
    auVar14 = (auVar15 | _DAT_00102050) ^ _DAT_00102060;
    iVar12 = auVar11._4_4_;
    iVar13 = auVar11._12_4_;
    auVar15 = (auVar15 | _DAT_00102040) ^ _DAT_00102060;
    uVar16 = -(uint)(iVar12 < auVar15._4_4_ ||
                    auVar15._4_4_ == iVar12 && auVar11._0_4_ < auVar15._0_4_);
    uVar17 = -(uint)(iVar13 < auVar15._12_4_ ||
                    auVar15._12_4_ == iVar13 && auVar11._8_4_ < auVar15._8_4_);
    uVar18 = -(uint)(iVar12 < auVar14._4_4_ ||
                    auVar14._4_4_ == iVar12 && auVar11._0_4_ < auVar14._0_4_);
    uVar19 = -(uint)(iVar13 < auVar14._12_4_ ||
                    auVar14._12_4_ == iVar13 && auVar11._8_4_ < auVar14._8_4_);
    local_28[uVar1] =
         (~uVar18 & uVar9 | uVar5 & uVar18) * (~uVar16 & uVar7 | uVar3 & uVar16) *
         (~uVar17 & uVar8 | uVar4 & uVar17) * (~uVar19 & uVar10 | uVar6 & uVar19);
    uVar1 = uVar1 + 1;
  } while (uVar1 != 10);
  f(local_28,10);
  return 0;
}

Assistant:

int main() { 
    constexpr uint32_t size = 10;
    f(ga, size);
    int aa[size];
    for (size_t count = 0; count < size; count++) {
        aa[count] = fact(count + 1);
    }
    f(aa, size);
}